

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall Fl_Text_Buffer::copy(Fl_Text_Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int extraout_EAX;
  int in_ECX;
  int iVar2;
  int nInserted;
  void *__src;
  char *__dest;
  int in_R8D;
  int iVar3;
  
  iVar3 = (int)src;
  nInserted = in_ECX - iVar3;
  if (this->mGapEnd - this->mGapStart < nInserted) {
    reallocate_with_gap(this,in_R8D,this->mPreferredGapSize + nInserted);
  }
  else if (this->mGapStart != in_R8D) {
    move_gap(this,in_R8D);
  }
  iVar1 = *(int *)(dst + 0x40);
  if (iVar1 < in_ECX) {
    iVar2 = iVar1 - iVar3;
    if (iVar2 != 0 && iVar3 <= iVar1) {
      memcpy(this->mBuf + in_R8D,(void *)((long)iVar3 + *(long *)(dst + 0x38)),(long)iVar2);
      __dest = this->mBuf + (iVar2 + in_R8D);
      __src = (void *)((long)*(int *)(dst + 0x44) + *(long *)(dst + 0x38));
      iVar3 = nInserted - iVar2;
      goto LAB_001cf0a9;
    }
    __dest = this->mBuf + in_R8D;
    iVar3 = (iVar3 - iVar1) + *(int *)(dst + 0x44);
  }
  else {
    __dest = this->mBuf + in_R8D;
  }
  __src = (void *)((long)iVar3 + *(long *)(dst + 0x38));
  iVar3 = nInserted;
LAB_001cf0a9:
  memcpy(__dest,__src,(long)iVar3);
  this->mGapStart = this->mGapStart + nInserted;
  this->mLength = this->mLength + nInserted;
  update_selections(this,in_R8D,0,nInserted);
  return extraout_EAX;
}

Assistant:

void Fl_Text_Buffer::copy(Fl_Text_Buffer * fromBuf, int fromStart,
			  int fromEnd, int toPos)
{
  IS_UTF8_ALIGNED2(fromBuf, fromStart)
  IS_UTF8_ALIGNED2(fromBuf, fromEnd)
  IS_UTF8_ALIGNED2(this, (toPos))
  
  int copiedLength = fromEnd - fromStart;
  
  /* Prepare the buffer to receive the new text.  If the new text fits in
   the current buffer, just move the gap (if necessary) to where
   the text should be inserted.  If the new text is too large, reallocate
   the buffer with a gap large enough to accomodate the new text and a
   gap of mPreferredGapSize */
  if (copiedLength > mGapEnd - mGapStart)
    reallocate_with_gap(toPos, copiedLength + mPreferredGapSize);
  else if (toPos != mGapStart)
    move_gap(toPos);
  
  /* Insert the new text (toPos now corresponds to the start of the gap) */
  if (fromEnd <= fromBuf->mGapStart) {
    memcpy(&mBuf[toPos], &fromBuf->mBuf[fromStart], copiedLength);
  } else if (fromStart >= fromBuf->mGapStart) {
    memcpy(&mBuf[toPos],
	   &fromBuf->mBuf[fromStart + (fromBuf->mGapEnd - fromBuf->mGapStart)],
	   copiedLength);
  } else {
    int part1Length = fromBuf->mGapStart - fromStart;
    memcpy(&mBuf[toPos], &fromBuf->mBuf[fromStart], part1Length);
    memcpy(&mBuf[toPos + part1Length],
	   &fromBuf->mBuf[fromBuf->mGapEnd], copiedLength - part1Length);
  }
  mGapStart += copiedLength;
  mLength += copiedLength;
  update_selections(toPos, 0, copiedLength);
}